

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlNewDocRawNode(void)

{
  int iVar1;
  int iVar2;
  xmlDocPtr val;
  xmlNsPtr val_00;
  xmlChar *val_01;
  xmlChar *val_02;
  xmlNodePtr val_03;
  int local_54;
  int n_content;
  xmlChar *content;
  int n_name;
  xmlChar *name;
  int n_ns;
  xmlNsPtr ns;
  int n_doc;
  xmlDocPtr doc;
  xmlNodePtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (ns._4_4_ = 0; (int)ns._4_4_ < 4; ns._4_4_ = ns._4_4_ + 1) {
    for (name._4_4_ = 0; (int)name._4_4_ < 2; name._4_4_ = name._4_4_ + 1) {
      for (content._4_4_ = 0; (int)content._4_4_ < 5; content._4_4_ = content._4_4_ + 1) {
        for (local_54 = 0; local_54 < 5; local_54 = local_54 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_xmlDocPtr(ns._4_4_,0);
          val_00 = gen_xmlNsPtr(name._4_4_,1);
          val_01 = gen_const_xmlChar_ptr(content._4_4_,2);
          val_02 = gen_const_xmlChar_ptr(local_54,3);
          val_03 = (xmlNodePtr)xmlNewDocRawNode(val,val_00,val_01,val_02);
          desret_xmlNodePtr(val_03);
          call_tests = call_tests + 1;
          des_xmlDocPtr(ns._4_4_,val,0);
          des_xmlNsPtr(name._4_4_,val_00,1);
          des_const_xmlChar_ptr(content._4_4_,val_01,2);
          des_const_xmlChar_ptr(local_54,val_02,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocRawNode",(ulong)(uint)(iVar2 - iVar1));
            ret_val._4_4_ = ret_val._4_4_ + 1;
            printf(" %d",(ulong)ns._4_4_);
            printf(" %d",(ulong)name._4_4_);
            printf(" %d",(ulong)content._4_4_);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlNewDocRawNode(void) {
    int test_ret = 0;

    int mem_base;
    xmlNodePtr ret_val;
    xmlDocPtr doc; /* the target document */
    int n_doc;
    xmlNsPtr ns; /* namespace (optional) */
    int n_ns;
    const xmlChar * name; /* the node name */
    int n_name;
    const xmlChar * content; /* raw text content (optional) */
    int n_content;

    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_ns = 0;n_ns < gen_nb_xmlNsPtr;n_ns++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_content = 0;n_content < gen_nb_const_xmlChar_ptr;n_content++) {
        mem_base = xmlMemBlocks();
        doc = gen_xmlDocPtr(n_doc, 0);
        ns = gen_xmlNsPtr(n_ns, 1);
        name = gen_const_xmlChar_ptr(n_name, 2);
        content = gen_const_xmlChar_ptr(n_content, 3);

        ret_val = xmlNewDocRawNode(doc, ns, name, content);
        desret_xmlNodePtr(ret_val);
        call_tests++;
        des_xmlDocPtr(n_doc, doc, 0);
        des_xmlNsPtr(n_ns, ns, 1);
        des_const_xmlChar_ptr(n_name, name, 2);
        des_const_xmlChar_ptr(n_content, content, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlNewDocRawNode",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_doc);
            printf(" %d", n_ns);
            printf(" %d", n_name);
            printf(" %d", n_content);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}